

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O3

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_updateGradient
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this)

{
  assign_op<float,_float> local_21;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
  local_20;
  
  if ((this->_AtA).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                  ,0x62,
                  "Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<float, -1, -1>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                 );
  }
  local_20.m_rhs.m_rhs = &this->_x;
  local_20.m_rhs.m_lhs = &this->_AtA;
  local_20.m_lhs = &this->_Atb;
  if ((this->_Atb).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      (this->_AtA).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows)
  {
    internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<float,float>>
              (&this->_w,&local_20,&local_21,(type)0x0);
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void _updateGradient() {
    // w <- A^T b - A^TA x
    _w = _Atb - _AtA*_x;
#ifdef EIGEN3_NNLS_DEBUG
    std::cerr << "NNLS(): Gradient at (" << _x.transpose()
              << ") = (" << _w.transpose() << ")" << std::endl;
#endif
  }